

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::adaptive_bit_model::update(adaptive_bit_model *this,uint bit)

{
  ushort uVar1;
  short sVar2;
  
  uVar1 = this->m_bit_0_prob;
  if (bit == 0) {
    sVar2 = (short)(0x800 - uVar1 >> 5);
  }
  else {
    sVar2 = -(uVar1 >> 5);
  }
  this->m_bit_0_prob = uVar1 + sVar2;
  return;
}

Assistant:

void adaptive_bit_model::update(uint bit)
    {
        if (!bit)
        {
            m_bit_0_prob += ((cSymbolCodecArithProbScale - m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
        }
        else
        {
            m_bit_0_prob -= (m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
        }
        CRNLIB_ASSERT(m_bit_0_prob >= 1);
        CRNLIB_ASSERT(m_bit_0_prob < cSymbolCodecArithProbScale);
    }